

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O3

Cluster * __thiscall amrex::Cluster::chop(Cluster *this)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Cluster *this_00;
  int minlen;
  int *piVar6;
  IntVect *pIVar7;
  int n;
  ulong uVar8;
  CutStatus CVar9;
  int iVar10;
  long lVar11;
  IntVect *pIVar12;
  int iVar13;
  vector<int,_std::allocator<int>_> *this_01;
  IntVect *pIVar14;
  IntVect *pIVar15;
  IntVect cut;
  CutStatus status [3];
  Array<Vector<int>,_3> hist;
  ulong local_b0;
  uint local_a8;
  ulong local_a0;
  ulong local_98;
  undefined8 local_90;
  int local_88;
  CutStatus CStack_84;
  long local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> vStack_60;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar3 = (this->m_bx).smallend.vect[1];
  iVar10 = (this->m_bx).bigend.vect[1];
  iVar13 = (this->m_bx).bigend.vect[2];
  iVar1 = (this->m_bx).smallend.vect[2];
  this_01 = &local_78;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a0 = local_a0 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (this_01,(long)(((this->m_bx).bigend.vect[0] - (this->m_bx).smallend.vect[0]) + 1),
             (value_type_conflict *)&local_a0);
  local_a0 = local_a0 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&vStack_60,(long)((iVar10 - iVar3) + 1),(value_type_conflict *)&local_a0);
  local_a0 = local_a0 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_48,(long)((iVar13 - iVar1) + 1),(value_type_conflict *)&local_a0);
  lVar4 = this->m_len;
  if (0 < lVar4) {
    piVar6 = this->m_ar->vect + 2;
    do {
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)((IntVect *)(piVar6 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]] =
           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)((IntVect *)(piVar6 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]]
           + 1;
      vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)piVar6[-1] - (long)(this->m_bx).smallend.vect[1]] =
           vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)piVar6[-1] - (long)(this->m_bx).smallend.vect[1]] + 1;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)*piVar6 - (long)(this->m_bx).smallend.vect[2]] =
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)*piVar6 - (long)(this->m_bx).smallend.vect[2]] + 1;
      piVar6 = piVar6 + 3;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  local_b0 = 0;
  local_a8 = 0;
  CVar9 = InvalidCut;
  lVar4 = 0;
  do {
    iVar3 = FindCut((this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start,
                    *(int *)((long)(this->m_bx).smallend.vect + lVar4),
                    *(int *)((long)(this->m_bx).bigend.vect + lVar4),
                    (CutStatus *)((long)&CStack_84 + lVar4));
    if ((int)*(CutStatus *)((long)&CStack_84 + lVar4) < (int)CVar9) {
      CVar9 = *(CutStatus *)((long)&CStack_84 + lVar4);
    }
    *(int *)((long)&local_b0 + lVar4) = iVar3;
    lVar4 = lVar4 + 4;
    this_01 = this_01 + 1;
  } while (lVar4 != 0xc);
  iVar3 = -1;
  uVar8 = 0;
  uVar5 = 0xffffffff;
  do {
    if ((&CStack_84)[uVar8] == CVar9) {
      iVar10 = *(int *)((long)&local_b0 + uVar8 * 4);
      iVar13 = (this->m_bx).bigend.vect[uVar8] - iVar10;
      iVar10 = iVar10 - (this->m_bx).smallend.vect[uVar8];
      if (iVar10 <= iVar13) {
        iVar13 = iVar10;
      }
      if (iVar3 <= iVar13) {
        uVar5 = uVar8 & 0xffffffff;
      }
      if (iVar3 < iVar13) {
        iVar3 = iVar13;
      }
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  lVar4 = (long)(int)uVar5;
  iVar3 = (this->m_bx).smallend.vect[lVar4];
  iVar10 = *(int *)((long)&local_b0 + lVar4 * 4);
  iVar13 = 0;
  if (iVar3 < iVar10) {
    lVar11 = 0;
    iVar13 = 0;
    do {
      iVar13 = iVar13 + (&local_78)[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11];
      lVar11 = lVar11 + 1;
    } while ((long)iVar10 - (long)iVar3 != lVar11);
  }
  pIVar7 = this->m_ar;
  lVar4 = this->m_len;
  local_a0 = local_b0;
  local_98 = uVar5 << 0x20 | (ulong)local_a8;
  pIVar15 = pIVar7;
  if (lVar4 != 0) {
    pIVar14 = pIVar7 + lVar4;
    do {
      lVar11 = (long)(int)uVar5;
      iVar3 = *(int *)((long)&local_a0 + lVar11 * 4);
      while (pIVar7->vect[lVar11] < iVar3) {
        pIVar7 = pIVar7 + 1;
        pIVar15 = pIVar14;
        if (pIVar7 == pIVar14) goto LAB_0063ba52;
      }
      do {
        pIVar12 = pIVar14;
        pIVar14 = pIVar12 + -1;
        pIVar15 = pIVar7;
        if (pIVar14 == pIVar7) goto LAB_0063ba52;
      } while (iVar3 <= pIVar12[-1].vect[lVar11]);
      local_88 = pIVar7->vect[2];
      local_90 = *(undefined8 *)pIVar7->vect;
      pIVar7->vect[2] = pIVar12[-1].vect[2];
      *(undefined8 *)pIVar7->vect = *(undefined8 *)pIVar14->vect;
      pIVar12[-1].vect[2] = local_88;
      *(undefined8 *)pIVar14->vect = local_90;
      pIVar7 = pIVar7 + 1;
      pIVar15 = pIVar14;
    } while (pIVar14 != pIVar7);
  }
LAB_0063ba52:
  this->m_len = (long)iVar13;
  minBox(this);
  this_00 = (Cluster *)operator_new(0x30);
  (this_00->m_bx).smallend.vect[0] = 1;
  (this_00->m_bx).smallend.vect[1] = 1;
  (this_00->m_bx).smallend.vect[2] = 1;
  (this_00->m_bx).bigend.vect[0] = 0;
  (this_00->m_bx).bigend.vect[1] = 0;
  *(undefined8 *)((this_00->m_bx).bigend.vect + 2) = 0;
  this_00->m_ar = pIVar15;
  this_00->m_len = (long)((int)lVar4 - iVar13);
  minBox(this_00);
  lVar4 = 0x48;
  do {
    pvVar2 = *(void **)((long)&local_90 + lVar4);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&local_80 + lVar4) - (long)pvVar2);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  return this_00;
}

Assistant:

Cluster*
Cluster::chop ()
{
    BL_ASSERT(m_len > 1);
    BL_ASSERT(!(m_ar == 0));

    const int*    lo  = m_bx.loVect();
    const int*    hi  = m_bx.hiVect();
    const IntVect len = m_bx.size();
    //
    // Compute histogram.
    //
    Array<Vector<int>,AMREX_SPACEDIM> hist;
    AMREX_D_TERM(hist[0].resize(len[0], 0);,
                 hist[1].resize(len[1], 0);,
                 hist[2].resize(len[2], 0);)
    for (int n = 0; n < m_len; n++)
    {
        const int* p = m_ar[n].getVect();
        AMREX_D_TERM( hist[0][p[0]-lo[0]]++;,
                hist[1][p[1]-lo[1]]++;,
                hist[2][p[2]-lo[2]]++; )
     }
    //
    // Find cutpoint and cutstatus in each index direction.
    //
    CutStatus mincut = InvalidCut;
    CutStatus status[AMREX_SPACEDIM];
    IntVect cut;
    for (int n = 0; n < AMREX_SPACEDIM; n++)
    {
        cut[n] = FindCut(hist[n].data(), lo[n], hi[n], status[n]);
        if (status[n] < mincut)
        {
            mincut = status[n];
        }
    }
    BL_ASSERT(mincut != InvalidCut);
    //
    // Select best cutpoint and direction.
    //
    int dir = -1;
    for (int n = 0, minlen = -1; n < AMREX_SPACEDIM; n++)
    {
        if (status[n] == mincut)
        {
            int mincutlen = std::min(cut[n]-lo[n],hi[n]-cut[n]);
            if (mincutlen >= minlen)
            {
                dir = n;
                minlen = mincutlen;
            }
        }
    }
    BL_ASSERT(dir >= 0 && dir < AMREX_SPACEDIM);

    int nlo = 0;
    for (int i = lo[dir]; i < cut[dir]; i++) {
        nlo += hist[dir][i-lo[dir]];
    }

    BL_ASSERT(nlo > 0 && nlo < m_len);

    int nhi = m_len - nlo;

    IntVect* prt_it = std::partition(m_ar, m_ar+m_len, Cut(cut,dir));

    BL_ASSERT((prt_it-m_ar) == nlo);
    BL_ASSERT(((m_ar+m_len)-prt_it) == nhi);

    m_len = nlo;
    minBox();

    return new Cluster(prt_it, nhi);
}